

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::evaluateGradient
          (CostAttributes *this,double time,VectorDynSize *values,VectorDynSize *partialDerivative,
          string *label)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  ostream *poVar10;
  bool isValid;
  ostringstream errorMsg;
  ostringstream errorTag;
  char local_371;
  double local_370;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_368;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_348;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_328 [6];
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1a8 [11];
  
  local_370 = time;
  iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::resize((ulong)partialDerivative);
  if (this->m_valid == false) {
    iDynTree::VectorDynSize::zero();
LAB_0019a1ae:
    bVar3 = true;
  }
  else {
    lVar7 = iDynTree::VectorDynSize::size();
    (*((this->selector).
       super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Selector[3])();
    lVar8 = iDynTree::MatrixDynSize::cols();
    if (lVar7 == lVar8) {
      peVar1 = (this->desiredTrajectory).
               super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar4 = (*peVar1->_vptr_TimeVaryingObject[2])(SUB84(local_370,0),peVar1,&local_371);
      if (local_371 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar10 = std::operator<<((ostream *)local_1a8,"costFirstPartialDerivativeWRT");
        std::operator<<(poVar10,(string *)label);
        poVar10 = std::operator<<((ostream *)local_328,"Unable to retrieve a valid desired ");
        poVar10 = std::operator<<(poVar10,(string *)label);
        std::operator<<(poVar10," at time: ");
        poVar10 = std::ostream::_M_insert<double>(local_370);
        std::operator<<(poVar10,".");
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("L2NormCost",
                   (char *)local_348.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data,(char *)local_368._0_8_);
      }
      else {
        uVar5 = iDynTree::VectorDynSize::size();
        uVar9 = iDynTree::VectorDynSize::size();
        if (uVar9 == uVar5) {
          peVar2 = (this->selector).
                   super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar6 = (*peVar2->_vptr_Selector[2])(peVar2,values);
          toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                  local_1a8,(VectorDynSize *)CONCAT44(extraout_var_00,iVar6));
          toEigen(&local_348,(VectorDynSize *)CONCAT44(extraout_var,iVar4));
          local_328[0].m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_1_ = (undefined1)
                    local_1a8[0].
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_cols.m_value;
          local_328[0].m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_1a8[0].
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_328[0].m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_1a8[0].
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_328[0].m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_348.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_328[0].m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_348.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_328[0].m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_1_ = local_348.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    ._16_1_;
          toEigen(&local_368,&this->buffer);
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                    (&local_368,local_328);
          toEigen(local_1a8,&this->gradientSubMatrix);
          toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_348
                  ,&this->buffer);
          local_328[0].m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_1a8[0].
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_328[0].m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_1a8[0].
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_328[0].m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               (long)local_348.
                     super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_data;
          local_328[0].m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_8_ = local_348.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_rows.m_value;
          local_328[0]._48_1_ =
               local_348.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ._16_1_;
          toEigen(&local_368,partialDerivative);
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>>
                    (&local_368,
                     (Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      *)local_328);
          goto LAB_0019a1ae;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar10 = std::operator<<((ostream *)local_1a8,"costFirstPartialDerivativeWRT");
        std::operator<<(poVar10,(string *)label);
        poVar10 = std::operator<<((ostream *)local_328,"The desired ");
        poVar10 = std::operator<<(poVar10,(string *)label);
        std::operator<<(poVar10," dimension does not match the size of the selector at time: ");
        poVar10 = std::ostream::_M_insert<double>(local_370);
        std::operator<<(poVar10,".");
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("L2NormCost",
                   (char *)local_348.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data,(char *)local_368._0_8_);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar10 = std::operator<<((ostream *)local_1a8,"costFirstPartialDerivativeWRT");
      std::operator<<(poVar10,(string *)label);
      poVar10 = std::operator<<((ostream *)local_328,"The ");
      poVar10 = std::operator<<(poVar10,(string *)label);
      std::operator<<(poVar10," dimension is not the one expected from the specified selector.");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("L2NormCost",
                 (char *)local_348.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data,(char *)local_368._0_8_);
    }
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool evaluateGradient(double time, const VectorDynSize& values, VectorDynSize& partialDerivative, const std::string &label) {
                partialDerivative.resize(values.size());

                if (!isValid()) {
                    partialDerivative.zero();
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                bool isValid;
                const VectorDynSize& desired = desiredTrajectory->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;
                    errorMsg << "Unable to retrieve a valid desired " << label <<" at time: " << time << ".";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                if (selector->size() != desired.size()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;;
                    errorMsg << "The desired " << label <<" dimension does not match the size of the selector at time: " << time << ".";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                iDynTree::toEigen(buffer) = iDynTree::toEigen(selector->select(values)) - iDynTree::toEigen(desired);
                iDynTree::toEigen(partialDerivative) = iDynTree::toEigen(gradientSubMatrix) * iDynTree::toEigen(buffer);

                return true;
            }